

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexCompleteness(DWARFVerifier *this,DWARFDie *Die,NameIndex *NI)

{
  Entry *pEVar1;
  uint uVar2;
  DWARFContext *this_00;
  NameIndex *pNVar3;
  NameIndex *pNVar4;
  Tag TVar5;
  DWARFFormValue *pDVar6;
  ArrayRef<unsigned_char> *pAVar7;
  DWARFDebugLoc *this_01;
  unsigned_long *puVar8;
  LocationList *pLVar9;
  uint64_t uVar10;
  undefined1 auVar11 [8];
  Entry *this_02;
  raw_ostream *this_03;
  Entry *__it;
  Entry *pEVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  Optional<unsigned_long> OVar16;
  ArrayRef<llvm::dwarf::Attribute> Attrs;
  ArrayRef<llvm::dwarf::Attribute> Attrs_00;
  ValueIterator local_cc8;
  ValueIterator local_bc8;
  ValueIterator local_ac8;
  ValueIterator local_9c8;
  ValueIterator local_8c8;
  ValueIterator local_7c8;
  undefined1 local_6c8 [8];
  Optional<llvm::DWARFFormValue> Location;
  ValueIterator local_5c8;
  ValueIterator local_4c8;
  undefined1 local_3c8 [8];
  Optional<llvm::ArrayRef<unsigned_char>_> Expr;
  undefined1 local_2c8 [8];
  anon_class_16_2_209e955a ContainsInterestingOperators;
  uint64_t local_1f8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_1c8;
  undefined1 local_1c0;
  uint64_t local_f8;
  undefined1 local_c8 [8];
  SmallVector<llvm::StringRef,_2U> EntryNames;
  unsigned_long local_88;
  uint64_t DieUnitOffset;
  uint64_t local_78;
  StringRef *local_70;
  undefined1 auStack_68 [8];
  StringRef Name;
  uint local_44;
  
  Name.Length = (size_t)this;
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_6c8,Die,DW_AT_declaration);
  if (Location.Storage.field_0._40_1_ != '\0') {
    return 0;
  }
  TVar5 = DWARFDie::getTag(Die);
  bVar15 = true;
  if (TVar5 != DW_TAG_subprogram) {
    TVar5 = DWARFDie::getTag(Die);
    bVar15 = TVar5 == DW_TAG_inlined_subroutine;
  }
  getNames((SmallVector<llvm::StringRef,_2U> *)local_c8,Die,bVar15);
  local_44 = 0;
  if ((uint)EntryNames.super_SmallVectorImpl<llvm::StringRef>.
            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX == 0
     ) goto switchD_00da91df_caseD_8;
  TVar5 = DWARFDie::getTag(Die);
  uVar13 = (ulong)TVar5;
  if (TVar5 < DW_TAG_volatile_type) {
    if ((0x1810040000000U >> (uVar13 & 0x3f) & 1) != 0) goto switchD_00da91df_caseD_8;
    if ((0x400020000000U >> (uVar13 & 0x3f) & 1) != 0) goto switchD_00da91df_caseD_a;
    if (uVar13 != 0x34) goto code_r0x00da91d1;
    this_00 = *(DWARFContext **)(Name.Length + 8);
    local_3c8._0_2_ = 2;
    Attrs.Length = 1;
    Attrs.Data = (Attribute *)local_3c8;
    DWARFDie::findRecursively((Optional<llvm::DWARFFormValue> *)local_6c8,Die,Attrs);
    if (Location.Storage.field_0._40_1_ == '\0') goto switchD_00da91df_caseD_8;
    local_2c8 = (undefined1  [8])Die;
    ContainsInterestingOperators.Die = (DWARFDie *)this_00;
    pDVar6 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                       ((OptionalStorage<llvm::DWARFFormValue,_true> *)local_6c8);
    DWARFFormValue::getAsBlock((Optional<llvm::ArrayRef<unsigned_char>_> *)local_3c8,pDVar6);
    if (Expr.Storage.field_0.value.Length._0_1_ == '\x01') {
      pAVar7 = optional_detail::OptionalStorage<llvm::ArrayRef<unsigned_char>,_true>::getValue
                         ((OptionalStorage<llvm::ArrayRef<unsigned_char>,_true> *)local_3c8);
      bVar15 = anon_func::anon_class_16_2_209e955a::operator()
                         ((anon_class_16_2_209e955a *)local_2c8,*pAVar7);
      if (!bVar15) goto switchD_00da91df_caseD_8;
      goto switchD_00da91df_caseD_9;
    }
    pDVar6 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                       ((OptionalStorage<llvm::DWARFFormValue,_true> *)local_6c8);
    OVar16 = DWARFFormValue::getAsSectionOffset(pDVar6);
    local_1c8 = OVar16.Storage.field_0;
    local_1c0 = OVar16.Storage.hasVal;
    if ((((undefined1  [16])OVar16.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       (this_01 = DWARFContext::getDebugLoc(this_00), this_01 == (DWARFDebugLoc *)0x0))
    goto switchD_00da91df_caseD_8;
    puVar8 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                       ((OptionalStorage<unsigned_long,_true> *)&local_1c8);
    pLVar9 = DWARFDebugLoc::getLocationListAtOffset(this_01,*puVar8);
    if (pLVar9 == (LocationList *)0x0) goto switchD_00da91df_caseD_8;
    __it = (Entry *)(pLVar9->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
                    super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
                    super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                    super_SmallVectorBase.BeginX;
    uVar2 = (pLVar9->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
            super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
            super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
            Size;
    lVar14 = (ulong)uVar2 * 0x28;
    pEVar1 = __it + uVar2;
    local_4c8.CurrentIndex = (NameIndex *)local_2c8;
    for (uVar13 = (ulong)(uVar2 >> 2); pEVar12 = __it, 0 < (long)uVar13; uVar13 = uVar13 - 1) {
      bVar15 = __gnu_cxx::__ops::
               _Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::$_1>::
               operator()((_Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::__1>
                           *)&local_4c8,__it);
      if (bVar15) goto LAB_00da938b;
      bVar15 = __gnu_cxx::__ops::
               _Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::$_1>::
               operator()((_Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::__1>
                           *)&local_4c8,__it + 1);
      pEVar12 = __it + 1;
      if (bVar15) goto LAB_00da938b;
      bVar15 = __gnu_cxx::__ops::
               _Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::$_1>::
               operator()((_Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::__1>
                           *)&local_4c8,__it + 2);
      pEVar12 = __it + 2;
      if (bVar15) goto LAB_00da938b;
      bVar15 = __gnu_cxx::__ops::
               _Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::$_1>::
               operator()((_Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::__1>
                           *)&local_4c8,__it + 3);
      pEVar12 = __it + 3;
      if (bVar15) goto LAB_00da938b;
      __it = __it + 4;
      lVar14 = lVar14 + -0xa0;
    }
    lVar14 = lVar14 / 0x28;
    if (lVar14 == 1) {
LAB_00da9664:
      bVar15 = __gnu_cxx::__ops::
               _Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::$_1>::
               operator()((_Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::__1>
                           *)&local_4c8,__it);
      pEVar12 = __it;
      if (!bVar15) goto switchD_00da91df_caseD_8;
    }
    else if (lVar14 == 2) {
LAB_00da9369:
      bVar15 = __gnu_cxx::__ops::
               _Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::$_1>::
               operator()((_Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::__1>
                           *)&local_4c8,__it);
      pEVar12 = __it;
      if (!bVar15) {
        __it = __it + 1;
        goto LAB_00da9664;
      }
    }
    else {
      if (lVar14 != 3) goto switchD_00da91df_caseD_8;
      bVar15 = __gnu_cxx::__ops::
               _Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::$_1>::
               operator()((_Iter_pred<isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::__1>
                           *)&local_4c8,__it);
      if (!bVar15) {
        __it = __it + 1;
        goto LAB_00da9369;
      }
    }
LAB_00da938b:
    if (pEVar12 == pEVar1) goto switchD_00da91df_caseD_8;
  }
  else {
code_r0x00da91d1:
    switch(TVar5) {
    case DW_TAG_imported_declaration:
    case DW_TAG_member:
    case DW_TAG_compile_unit:
      goto switchD_00da91df_caseD_8;
    case DW_TAG_imported_declaration|DW_TAG_array_type:
    case DW_TAG_lexical_block:
    case DW_TAG_imported_declaration|DW_TAG_enumeration_type:
    case DW_TAG_imported_declaration|DW_TAG_enumeration_type|DW_TAG_class_type:
    case DW_TAG_pointer_type:
    case DW_TAG_reference_type:
      break;
    case DW_TAG_label:
switchD_00da91df_caseD_a:
      local_3c8 = (undefined1  [8])0x52005500120011;
      Attrs_00.Length = 4;
      Attrs_00.Data = (Attribute *)local_3c8;
      DWARFDie::findRecursively((Optional<llvm::DWARFFormValue> *)local_6c8,Die,Attrs_00);
      if (Location.Storage.field_0._40_1_ == '\0') goto switchD_00da91df_caseD_8;
      break;
    default:
      if ((TVar5 - 0x4106 < 2) || (TVar5 == DW_TAG_formal_parameter)) goto switchD_00da91df_caseD_8;
    }
  }
switchD_00da91df_caseD_9:
  uVar10 = DWARFDie::getOffset(Die);
  local_88 = uVar10 - (Die->U->Header).Offset;
  local_70 = (StringRef *)
             ((long)local_c8 +
             (ulong)(uint)EntryNames.super_SmallVectorImpl<llvm::StringRef>.
                          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                          super_SmallVectorBase.BeginX * 0x10);
  local_44 = 0;
  for (auVar11 = local_c8; auVar11 != (undefined1  [8])local_70;
      auVar11 = (undefined1  [8])((long)auVar11 + 0x10)) {
    auStack_68 = (undefined1  [8])((StringRef *)auVar11)->Data;
    Name.Data = (char *)((StringRef *)auVar11)->Length;
    DWARFDebugNames::NameIndex::equal_range
              ((iterator_range<llvm::DWARFDebugNames::ValueIterator> *)local_6c8,NI,
               *(StringRef *)auVar11);
    DWARFDebugNames::ValueIterator::ValueIterator(&local_8c8,(ValueIterator *)local_6c8);
    DWARFDebugNames::ValueIterator::ValueIterator(&local_7c8,&local_5c8);
    DWARFDebugNames::ValueIterator::ValueIterator(&local_ac8,&local_8c8);
    DWARFDebugNames::ValueIterator::ValueIterator(&local_9c8,&local_7c8);
    DWARFDebugNames::ValueIterator::ValueIterator(&local_4c8,&local_ac8);
    DWARFDebugNames::ValueIterator::ValueIterator(&local_bc8,&local_9c8);
    DWARFDebugNames::ValueIterator::ValueIterator((ValueIterator *)local_2c8,&local_4c8);
    DWARFDebugNames::ValueIterator::ValueIterator((ValueIterator *)&local_1c8,&local_bc8);
    while ((local_2c8 != (undefined1  [8])local_1c8.value || (local_1f8 != local_f8))) {
      DWARFDebugNames::ValueIterator::ValueIterator
                ((ValueIterator *)local_3c8,(ValueIterator *)local_2c8);
      this_02 = optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::getValue
                          ((OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *)
                           ((long)&Expr.Storage.field_0 + 8));
      OVar16 = DWARFDebugNames::Entry::getDIEUnitOffset(this_02);
      EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._8_8_ =
           OVar16.Storage.field_0;
      bVar15 = llvm::operator==((Optional<unsigned_long> *)
                                (EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts
                                 [1].buffer + 8),&local_88);
      DWARFDebugNames::ValueIterator::~ValueIterator((ValueIterator *)local_3c8);
      if (bVar15) break;
      DWARFDebugNames::ValueIterator::next((ValueIterator *)local_2c8);
    }
    DWARFDebugNames::ValueIterator::ValueIterator(&local_cc8,(ValueIterator *)local_2c8);
    DWARFDebugNames::ValueIterator::~ValueIterator((ValueIterator *)&local_1c8);
    DWARFDebugNames::ValueIterator::~ValueIterator((ValueIterator *)local_2c8);
    DWARFDebugNames::ValueIterator::~ValueIterator(&local_bc8);
    DWARFDebugNames::ValueIterator::~ValueIterator(&local_4c8);
    pNVar4 = local_7c8.CurrentIndex;
    pNVar3 = local_cc8.CurrentIndex;
    DieUnitOffset = local_7c8.DataOffset;
    local_78 = local_cc8.DataOffset;
    DWARFDebugNames::ValueIterator::~ValueIterator(&local_cc8);
    DWARFDebugNames::ValueIterator::~ValueIterator(&local_9c8);
    DWARFDebugNames::ValueIterator::~ValueIterator(&local_ac8);
    DWARFDebugNames::ValueIterator::~ValueIterator(&local_7c8);
    DWARFDebugNames::ValueIterator::~ValueIterator(&local_8c8);
    iterator_range<llvm::DWARFDebugNames::ValueIterator>::~iterator_range
              ((iterator_range<llvm::DWARFDebugNames::ValueIterator> *)local_6c8);
    if ((pNVar4 == pNVar3) && (DieUnitOffset == local_78)) {
      this_03 = error((DWARFVerifier *)Name.Length);
      local_3c8 = (undefined1  [8])NI->Base;
      local_2c8 = (undefined1  [8])DWARFDie::getOffset(Die);
      TVar5 = DWARFDie::getTag(Die);
      local_1c8.value._0_2_ = TVar5;
      formatv<unsigned_long,_unsigned_long,_llvm::dwarf::Tag,_llvm::StringRef_&>
                ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>_>
                  *)local_6c8,
                 "Name Index @ {0:x}: Entry for DIE @ {1:x} ({2}) with name {3} missing.\n",
                 (unsigned_long *)local_3c8,(unsigned_long *)local_2c8,(Tag *)&local_1c8.value,
                 (StringRef *)auStack_68);
      raw_ostream::operator<<(this_03,(formatv_object_base *)local_6c8);
      formatv_object_base::~formatv_object_base((formatv_object_base *)local_6c8);
      local_44 = local_44 + 1;
    }
  }
switchD_00da91df_caseD_8:
  SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl((SmallVectorImpl<llvm::StringRef> *)local_c8);
  return local_44;
}

Assistant:

unsigned DWARFVerifier::verifyNameIndexCompleteness(
    const DWARFDie &Die, const DWARFDebugNames::NameIndex &NI) {

  // First check, if the Die should be indexed. The code follows the DWARF v5
  // wording as closely as possible.

  // "All non-defining declarations (that is, debugging information entries
  // with a DW_AT_declaration attribute) are excluded."
  if (Die.find(DW_AT_declaration))
    return 0;

  // "DW_TAG_namespace debugging information entries without a DW_AT_name
  // attribute are included with the name “(anonymous namespace)”.
  // All other debugging information entries without a DW_AT_name attribute
  // are excluded."
  // "If a subprogram or inlined subroutine is included, and has a
  // DW_AT_linkage_name attribute, there will be an additional index entry for
  // the linkage name."
  auto IncludeLinkageName = Die.getTag() == DW_TAG_subprogram ||
                            Die.getTag() == DW_TAG_inlined_subroutine;
  auto EntryNames = getNames(Die, IncludeLinkageName);
  if (EntryNames.empty())
    return 0;

  // We deviate from the specification here, which says:
  // "The name index must contain an entry for each debugging information entry
  // that defines a named subprogram, label, variable, type, or namespace,
  // subject to ..."
  // Instead whitelisting all TAGs representing a "type" or a "subprogram", to
  // make sure we catch any missing items, we instead blacklist all TAGs that we
  // know shouldn't be indexed.
  switch (Die.getTag()) {
  // Compile units and modules have names but shouldn't be indexed.
  case DW_TAG_compile_unit:
  case DW_TAG_module:
    return 0;

  // Function and template parameters are not globally visible, so we shouldn't
  // index them.
  case DW_TAG_formal_parameter:
  case DW_TAG_template_value_parameter:
  case DW_TAG_template_type_parameter:
  case DW_TAG_GNU_template_parameter_pack:
  case DW_TAG_GNU_template_template_param:
    return 0;

  // Object members aren't globally visible.
  case DW_TAG_member:
    return 0;

  // According to a strict reading of the specification, enumerators should not
  // be indexed (and LLVM currently does not do that). However, this causes
  // problems for the debuggers, so we may need to reconsider this.
  case DW_TAG_enumerator:
    return 0;

  // Imported declarations should not be indexed according to the specification
  // and LLVM currently does not do that.
  case DW_TAG_imported_declaration:
    return 0;

  // "DW_TAG_subprogram, DW_TAG_inlined_subroutine, and DW_TAG_label debugging
  // information entries without an address attribute (DW_AT_low_pc,
  // DW_AT_high_pc, DW_AT_ranges, or DW_AT_entry_pc) are excluded."
  case DW_TAG_subprogram:
  case DW_TAG_inlined_subroutine:
  case DW_TAG_label:
    if (Die.findRecursively(
            {DW_AT_low_pc, DW_AT_high_pc, DW_AT_ranges, DW_AT_entry_pc}))
      break;
    return 0;

  // "DW_TAG_variable debugging information entries with a DW_AT_location
  // attribute that includes a DW_OP_addr or DW_OP_form_tls_address operator are
  // included; otherwise, they are excluded."
  //
  // LLVM extension: We also add DW_OP_GNU_push_tls_address to this list.
  case DW_TAG_variable:
    if (isVariableIndexable(Die, DCtx))
      break;
    return 0;

  default:
    break;
  }

  // Now we know that our Die should be present in the Index. Let's check if
  // that's the case.
  unsigned NumErrors = 0;
  uint64_t DieUnitOffset = Die.getOffset() - Die.getDwarfUnit()->getOffset();
  for (StringRef Name : EntryNames) {
    if (none_of(NI.equal_range(Name), [&](const DWARFDebugNames::Entry &E) {
          return E.getDIEUnitOffset() == DieUnitOffset;
        })) {
      error() << formatv("Name Index @ {0:x}: Entry for DIE @ {1:x} ({2}) with "
                         "name {3} missing.\n",
                         NI.getUnitOffset(), Die.getOffset(), Die.getTag(),
                         Name);
      ++NumErrors;
    }
  }
  return NumErrors;
}